

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportScriptPubKeys
          (LegacyScriptPubKeyMan *this,
          set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool have_solving_data,int64_t timestamp)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  pointer *__ptr;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  WalletBatch local_48;
  long local_38;
  WalletDatabase *pWVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_48,pWVar3,1);
  p_Var4 = (script_pub_keys->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(script_pub_keys->_M_t)._M_impl.super__Rb_tree_header;
  bVar1 = true;
  local_48.m_database = pWVar3;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      if (have_solving_data) {
        iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[3])
                          (this,p_Var4 + 1);
        if (iVar2 == 0) goto LAB_004d1ff1;
      }
      else {
LAB_004d1ff1:
        bVar1 = AddWatchOnlyWithDB(this,&local_48,(CScript *)(p_Var4 + 1),timestamp);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_004d201c;
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    bVar1 = true;
  }
LAB_004d201c:
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_48.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_48.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportScriptPubKeys(const std::set<CScript>& script_pub_keys, const bool have_solving_data, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const CScript& script : script_pub_keys) {
        if (!have_solving_data || !IsMine(script)) { // Always call AddWatchOnly for non-solvable watch-only, so that watch timestamp gets updated
            if (!AddWatchOnlyWithDB(batch, script, timestamp)) {
                return false;
            }
        }
    }
    return true;
}